

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O0

DOMElement * __thiscall xercesc_4_0::DOMElementImpl::getLastElementChild(DOMElementImpl *this)

{
  int iVar1;
  undefined4 extraout_var;
  DOMElement *pDVar2;
  undefined4 extraout_var_00;
  DOMElement *e;
  DOMNode *n;
  DOMElementImpl *this_local;
  
  iVar1 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[8])();
  e = (DOMElement *)CONCAT44(extraout_var,iVar1);
  while( true ) {
    if (e == (DOMElement *)0x0) {
      return (DOMElement *)0x0;
    }
    iVar1 = (*(e->super_DOMNode)._vptr_DOMNode[4])();
    if (iVar1 == 1) break;
    if ((iVar1 == 5) &&
       (pDVar2 = getLastElementChild(this,&e->super_DOMNode), pDVar2 != (DOMElement *)0x0)) {
      return pDVar2;
    }
    iVar1 = (*(e->super_DOMNode)._vptr_DOMNode[9])();
    e = (DOMElement *)CONCAT44(extraout_var_00,iVar1);
  }
  return e;
}

Assistant:

DOMElement * DOMElementImpl::getLastElementChild() const
{
    DOMNode* n = getLastChild();
    while (n != NULL) {
        switch (n->getNodeType()) {
            case DOMNode::ELEMENT_NODE:
                return (DOMElement*) n;
            case DOMNode::ENTITY_REFERENCE_NODE:
                {
                    DOMElement* e = getLastElementChild(n);
                    if (e != NULL)
                        return e;
                }
                break;
            default:
                break;
        }
        n = n->getPreviousSibling();
    }
    return NULL;
}